

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::EnqueueSignal
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IFence *pFence,Uint64 Value,
          int param_3)

{
  string msg;
  string local_30;
  
  if ((this->m_Desc).IsDeferred == true) {
    FormatString<char[57]>
              (&local_30,(char (*) [57])"Fence signal can only be enqueued from immediate context");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"EnqueueSignal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6a4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if (pFence == (IFence *)0x0) {
    FormatString<char[23]>(&local_30,(char (*) [23])0x80f7aa);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"EnqueueSignal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6a5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::EnqueueSignal(IFence* pFence, Uint64 Value, int)
{
    DEV_CHECK_ERR(!IsDeferred(), "Fence signal can only be enqueued from immediate context");
    DEV_CHECK_ERR(pFence != nullptr, "Fence must not be null");
}